

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O1

void * CP_distributeDataFromRankZero
                 (SstStream Stream,void *root_info,FFSTypeHandle Type,void **RetDataBlock)

{
  int count;
  void *__dest;
  undefined8 uVar1;
  undefined8 uVar2;
  void *buffer;
  size_t __size;
  int DataSize;
  void *RetVal;
  int local_3c;
  int local_38;
  undefined4 uStack_34;
  
  if (Stream->Rank == 0) {
    uVar1 = create_FFSBuffer();
    uVar2 = FMFormat_of_original(Type);
    buffer = (void *)FFSencode(uVar1,uVar2,root_info);
    local_3c = local_38;
    SMPI_Bcast(&local_3c,1,SMPI_INT,0,Stream->mpiComm);
    SMPI_Bcast(buffer,local_3c,SMPI_CHAR,0,Stream->mpiComm);
    __size = (size_t)local_3c;
    __dest = malloc(__size);
    memcpy(__dest,buffer,__size);
    free_FFSBuffer(uVar1);
  }
  else {
    SMPI_Bcast(&local_3c,1,SMPI_INT,0,Stream->mpiComm);
    count = local_3c;
    __dest = malloc((long)local_3c);
    SMPI_Bcast(__dest,count,SMPI_CHAR,0,Stream->mpiComm);
  }
  FFSdecode_in_place(Stream->CPInfo->ffs_c,__dest,&local_38);
  *RetDataBlock = __dest;
  return (void *)CONCAT44(uStack_34,local_38);
}

Assistant:

void *CP_distributeDataFromRankZero(SstStream Stream, void *root_info, FFSTypeHandle Type,
                                    void **RetDataBlock)
{
    int DataSize;
    char *Buffer;
    void *RetVal;

    if (Stream->Rank == 0)
    {
        FFSBuffer Buf = create_FFSBuffer();
        size_t encodeSize;
        char *tmp = FFSencode(Buf, FMFormat_of_original(Type), root_info, &encodeSize);
        DataSize = (int)encodeSize;
        SMPI_Bcast(&DataSize, 1, SMPI_INT, 0, Stream->mpiComm);
        SMPI_Bcast(tmp, DataSize, SMPI_CHAR, 0, Stream->mpiComm);
        Buffer = malloc(DataSize);
        memcpy(Buffer, tmp, DataSize);
        free_FFSBuffer(Buf);
    }
    else
    {
        SMPI_Bcast(&DataSize, 1, SMPI_INT, 0, Stream->mpiComm);
        Buffer = malloc(DataSize);
        SMPI_Bcast(Buffer, DataSize, SMPI_CHAR, 0, Stream->mpiComm);
    }

    FFSContext context = Stream->CPInfo->ffs_c;
    // FFSTypeHandle ffs_type = FFSTypeHandle_from_encode(context, Buffer);

    FFSdecode_in_place(context, Buffer, &RetVal);
    //    printf("Decode for rank %d is : \n", Stream->Rank);
    //    FMdump_data(FMFormat_of_original(Type), RetVal, 1024000);
    *RetDataBlock = Buffer;
    return RetVal;
}